

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O2

void __thiscall
num_parse_test_parse_double_Test::num_parse_test_parse_double_Test
          (num_parse_test_parse_double_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00178bb0;
  return;
}

Assistant:

TEST(num_parse_test, parse_double) {
  uint8_t f_as_ui[8] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xf8, 0x3f};
  auto resf64 = parse<double, sizeof(double), little_endian_tag>(
      reinterpret_cast<uint8_t const *>(&f_as_ui));
  EXPECT_EQ(resf64, 1.5);

  uint8_t f_as_ui2[8] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xf2, 0x3f};
  resf64 = parse<double, sizeof(double), little_endian_tag>(
      reinterpret_cast<uint8_t const *>(&f_as_ui2));
  EXPECT_EQ(resf64, 1.125);

  uint8_t f_as_ui3[8] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x02, 0xc0};
  resf64 = parse<double, sizeof(double), little_endian_tag>(
      reinterpret_cast<uint8_t const *>(&f_as_ui3));
  EXPECT_EQ(resf64, -2.25);
}